

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::OpenDocument(Application *this,char *name)

{
  int iVar1;
  Document *doc;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_Application[3])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_Application[2])(this);
    doc = (Document *)CONCAT44(extraout_var,iVar1);
    if (doc != (Document *)0x0) {
      DocumentStore::AddDocument(this->_docs,doc);
      (*this->_vptr_Application[4])(this,doc);
      Document::Open(doc);
      (**doc->_vptr_Document)(doc);
      return;
    }
  }
  return;
}

Assistant:

void Application::OpenDocument(const char* name) {
    if (!CanOpenDocument(name)) {
        // cannot handle this document
        return;
    }

    Document* doc = DoCreateDocument();

    if (doc) {
        _docs->AddDocument(doc);
        AboutToOpenDocument(doc);
        doc->Open();
        doc->DoRead();
    }
}